

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset,char surrogate)

{
  int iVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  wchar_t ucs;
  int iVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  size_type *psVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  undefined3 in_register_00000089;
  ulong uVar12;
  ulong uVar13;
  size_type bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong local_68;
  undefined4 local_60;
  undefined4 local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  local_5c = CONCAT31(in_register_00000089,surrogate);
  local_38 = (ulong)*offset;
  uVar4 = text->_M_string_length;
  if (uVar4 <= local_38) goto LAB_00114c1b;
  local_60 = (undefined4)CONCAT71(in_register_00000009,hyphenate);
  uVar10 = 0;
  uVar13 = local_38;
  iVar1 = 0;
  local_68 = local_38;
  do {
    do {
      iVar11 = iVar1;
      uVar12 = uVar13;
      uVar13 = local_68;
      ucs = utf8_next_char(text,&local_68);
      if (ucs == L' ') {
        uVar10 = uVar13 & 0xffffffff;
      }
      else if ((ucs == L'\n') || (ucs == L'\0')) {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        uVar13 = local_68 & 0xffffffff;
        goto LAB_00114c12;
      }
      iVar6 = mk_wcwidth(ucs);
      iVar1 = iVar6 + iVar11;
    } while (iVar1 <= width);
    pcVar5 = (text->_M_dataplus)._M_p;
    cVar2 = pcVar5[uVar12];
    cVar3 = pcVar5[uVar13];
    if ((cVar2 != ' ') && (cVar3 == ' ')) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      goto LAB_00114c12;
    }
    iVar9 = (int)uVar10;
    if (((cVar2 == ' ') && (cVar3 != ' ')) && (iVar9 != 0)) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00114c12;
    }
  } while ((cVar2 == ' ') || (cVar3 == ' '));
  if (iVar9 == 0) {
    if (uVar13 == *offset && width < iVar6) {
      std::__cxx11::string::_M_replace_aux((ulong)line,0,line->_M_string_length,'\x01');
      uVar13 = local_68 & 0xffffffff;
    }
    else if ((char)local_60 == '\0') {
LAB_00114bdc:
      std::__cxx11::string::substr((ulong)&local_88,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else if (iVar11 < width) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)text);
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_58,local_58._M_string_length,0,'\x01');
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar7[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_88._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)line,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (uVar12 == *offset) goto LAB_00114bdc;
      std::__cxx11::string::substr((ulong)&local_58,(ulong)text);
      std::operator+(&local_88,&local_58,'-');
      std::__cxx11::string::operator=((string *)line,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar13 = uVar12 & 0xffffffff;
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)text);
    std::__cxx11::string::operator=((string *)line,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar13 = (ulong)(iVar9 + 1);
  }
LAB_00114c12:
  *offset = (uint)uVar13;
LAB_00114c1b:
  return local_38 < uVar4;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset,
  char surrogate)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (char_width > width && last_bytes == offset)
          {
            // the first character is already too wide,
            // no other way to split the line but to replace the character
            // with a surrogate
            line = surrogate;
            offset = bytes;
          }
          else
          {
            if (hyphenate)
            {
              if (line_width + 1 <= width)
              {
                // if the last good part + hyphen is short enough,
                // i.e. the just read character is wider than one column
                line = text.substr (offset, last_bytes - offset) + '-';
                offset = last_bytes;
              }
              else if (last_last_bytes - offset > 0)
              {
                // sacrifice last character from the last good part,
                // but only if there is at least one character left
                line = text.substr (offset, last_last_bytes - offset) + '-';
                offset = last_last_bytes;
              }
              else
              {
                // no other way to split the line but to omit the hyphen
                line = text.substr (offset, last_bytes - offset);
                offset = last_bytes;
              }
            }
            else
            {
              // just use the last good part
              line = text.substr (offset, last_bytes - offset);
              offset = last_bytes;
            }
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}